

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contract.cpp
# Opt level: O0

void jbcoin::LogThrow(string *title)

{
  bool bVar1;
  Stream local_1c0;
  ScopedStream local_1b0;
  Stream local_20;
  string *local_10;
  string *title_local;
  
  local_10 = title;
  debugLog();
  beast::Journal::warn((Journal *)&local_20);
  bVar1 = beast::Journal::Stream::operator_cast_to_bool(&local_20);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    debugLog();
    beast::Journal::warn((Journal *)&local_1c0);
    beast::Journal::Stream::operator<<(&local_1b0,&local_1c0,local_10);
    beast::Journal::ScopedStream::~ScopedStream(&local_1b0);
  }
  return;
}

Assistant:

void
LogThrow (std::string const& title)
{
    JLOG(debugLog().warn()) << title;
}